

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

void __thiscall
Inline::SetupInlineeFrame
          (Inline *this,Func *inlinee,Instr *inlineeStart,ArgSlot actualCount,Opnd *functionObject)

{
  StackSym *stackSym_00;
  SymOpnd *newDst;
  Instr *this_00;
  Instr *instr;
  SymOpnd *symOpnd;
  StackSym *stackSym;
  uint instrIndex;
  IRType types [3];
  Opnd *srcs [3];
  ArgSlot local_36 [3];
  Opnd *pOStack_30;
  ArgSlot argSlots [3];
  Opnd *functionObject_local;
  ArgSlot actualCount_local;
  Instr *inlineeStart_local;
  Func *inlinee_local;
  Inline *this_local;
  
  local_36[0] = actualCount + 1;
  local_36[1] = actualCount + 2;
  local_36[2] = actualCount + 3;
  pOStack_30 = functionObject;
  _instrIndex = IR::IntConstOpnd::New((ulong)actualCount,TyInt16,inlinee,true);
  IR::AddrOpnd::NewNull(inlinee);
  stackSym._5_2_ = 0x1704;
  stackSym._7_1_ = 4;
  for (stackSym._0_4_ = 0; (uint)stackSym < 3; stackSym._0_4_ = (uint)stackSym + 1) {
    stackSym_00 = SymTable::GetArgSlotSym(inlinee->m_symTable,local_36[(uint)stackSym]);
    *(uint *)&stackSym_00->field_0x18 = *(uint *)&stackSym_00->field_0x18 & 0xffffbfff | 0x4000;
    Func::SetArgOffset(this->topFunc,stackSym_00,
                       (this->currentInlineeFrameSlot + (uint)stackSym) * 8);
    newDst = IR::SymOpnd::New(&stackSym_00->super_Sym,0,
                              *(IRType *)((long)&stackSym + (ulong)(uint)stackSym + 5),inlinee);
    this_00 = IR::Instr::New(InlineeMetaArg,inlinee);
    IR::Instr::SetDst(this_00,&newDst->super_Opnd);
    if (*(long *)(&instrIndex + (ulong)(uint)stackSym * 2) != 0) {
      IR::Instr::SetSrc1(this_00,*(Opnd **)(&instrIndex + (ulong)(uint)stackSym * 2));
    }
    IR::Instr::InsertBefore(inlineeStart,this_00);
    if ((uint)stackSym == 0) {
      Func::SetInlineeFrameStartSym(inlinee,stackSym_00);
    }
  }
  return;
}

Assistant:

void
Inline::SetupInlineeFrame(Func *inlinee, IR::Instr *inlineeStart, Js::ArgSlot actualCount, IR::Opnd *functionObject)
{
    Js::ArgSlot argSlots[Js::Constants::InlineeMetaArgCount] = {
        actualCount + 1u, /* argc */
        actualCount + 2u, /* function object */
        actualCount + 3u  /* arguments object slot */
    };

    IR::Opnd *srcs[Js::Constants::InlineeMetaArgCount] = {
        IR::IntConstOpnd::New(actualCount, TyInt16, inlinee, true /*dontEncode*/),

        /*
         * Don't initialize this slot with the function object yet. In compat mode we evaluate
         * the target only after evaluating all arguments. Having this SymOpnd here ensures it gets
         * the correct slot in the frame. Lowerer fills this slot with the function object just
         * before entering the inlinee when we're sure we've evaluated the target in all modes.
         */
        nullptr,

        IR::AddrOpnd::NewNull(inlinee)
    };

    const IRType types[Js::Constants::InlineeMetaArgCount] = {
        TyMachReg,
        TyVar,
        TyMachReg
    };

    for (unsigned instrIndex = 0; instrIndex < Js::Constants::InlineeMetaArgCount; instrIndex++)
    {
        StackSym    *stackSym = inlinee->m_symTable->GetArgSlotSym(argSlots[instrIndex]);
        stackSym->m_isInlinedArgSlot = true;
        this->topFunc->SetArgOffset(stackSym, (currentInlineeFrameSlot + instrIndex) * MachPtr);
        IR::SymOpnd *symOpnd  = IR::SymOpnd::New(stackSym, 0, types[instrIndex], inlinee);

        IR::Instr   *instr    = IR::Instr::New(Js::OpCode::InlineeMetaArg, inlinee);
        instr->SetDst(symOpnd);
        if (srcs[instrIndex])
        {
            instr->SetSrc1(srcs[instrIndex]);
        }
        inlineeStart->InsertBefore(instr);

        if (instrIndex == 0)
        {
            inlinee->SetInlineeFrameStartSym(stackSym);
        }
    }
}